

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

Vec_Ptr_t * Saig_ManBmcTerSimPo(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *vInfos;
  void **ppvVar2;
  uint *pPrev;
  int iVar3;
  uint iFrame;
  ulong uVar4;
  Aig_Man_t *pAVar5;
  ulong uVar6;
  
  vInfos = (Vec_Ptr_t *)malloc(0x10);
  vInfos->nCap = 100;
  vInfos->nSize = 0;
  pAVar5 = (Aig_Man_t *)0x320;
  ppvVar2 = (void **)malloc(800);
  vInfos->pArray = ppvVar2;
  uVar6 = 100;
  pPrev = (uint *)0x0;
  uVar4 = 0;
  do {
    if ((int)((uVar4 & 0xffffffff) / 100) * -100 + (int)uVar4 == 0) {
      Abc_Print((int)pAVar5,"Frame %5d\n",uVar4 & 0xffffffff);
    }
    pPrev = Saig_ManBmcTerSimOne(p,pPrev);
    iVar1 = (int)uVar6;
    if ((int)uVar4 == iVar1) {
      if (iVar1 < 0x10) {
        if (vInfos->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc(0x80);
        }
        else {
          ppvVar2 = (void **)realloc(vInfos->pArray,0x80);
        }
        vInfos->pArray = ppvVar2;
        vInfos->nCap = 0x10;
        uVar6 = 0x10;
      }
      else {
        uVar6 = (ulong)(uint)(iVar1 * 2);
        if (vInfos->pArray == (void **)0x0) {
          ppvVar2 = (void **)malloc(uVar6 * 8);
        }
        else {
          ppvVar2 = (void **)realloc(vInfos->pArray,uVar6 * 8);
        }
        vInfos->pArray = ppvVar2;
        vInfos->nCap = iVar1 * 2;
      }
    }
    else {
      ppvVar2 = vInfos->pArray;
    }
    iVar3 = (int)(uVar4 + 1);
    vInfos->nSize = iVar3;
    ppvVar2[uVar4] = pPrev;
    pAVar5 = p;
    iVar1 = Saig_ManBmcTerSimCount01Po(p,pPrev);
    uVar4 = uVar4 + 1;
  } while (p->nTruePos <= iVar1);
  iFrame = iVar3 - 1;
  Abc_Print((int)pAVar5,"Detected terminary PO in frame %d.\n",(ulong)iFrame);
  Saig_ManBmcCountNonternary(p,vInfos,iFrame);
  return vInfos;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcTerSimPo( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    unsigned * pInfo = NULL;
    int i, nPoBin;
    vInfos = Vec_PtrAlloc( 100 );
    for ( i = 0; ; i++ )
    {
        if ( i % 100 == 0 )
            Abc_Print( 1, "Frame %5d\n", i );
        pInfo = Saig_ManBmcTerSimOne( p, pInfo );
        Vec_PtrPush( vInfos, pInfo );
        nPoBin = Saig_ManBmcTerSimCount01Po( p, pInfo );
        if ( nPoBin < Saig_ManPoNum(p) )
            break;
    }
    Abc_Print( 1, "Detected terminary PO in frame %d.\n", i );
    Saig_ManBmcCountNonternary( p, vInfos, i );
    return vInfos;
}